

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::JUnitReporter::log_assert(JUnitReporter *this,AssertData *rb)

{
  pointer *ppJVar1;
  int *piVar2;
  pointer pJVar3;
  pointer __first;
  char cVar4;
  pthread_mutex_t *__mutex;
  JUnitReporter *pJVar5;
  AssertData *pAVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  IContextScope **ppIVar11;
  pointer __result;
  pointer pJVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  long lVar14;
  uint uVar15;
  _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *this_00;
  String *pSVar16;
  undefined1 *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ulong uVar17;
  long in_FS_OFFSET;
  ostringstream os;
  undefined1 auStack_228 [6];
  allocator local_222;
  allocator local_221;
  pthread_mutex_t *local_220;
  JUnitReporter *local_218;
  AssertData *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [104];
  ios_base local_138 [264];
  
  if (rb->m_failed == true) {
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
LAB_00146660:
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    local_220 = (pthread_mutex_t *)&this->mutex;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    pcVar8 = skipPathFromFilename(rb->m_file);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)(auStack_228 + *(long *)(local_1a8._M_p + -0x18)) + 0x80);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,sVar9);
    }
    pcVar8 = "(";
    if (this->opt->gnu_file_line != false) {
      pcVar8 = ":";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,1);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    uVar17 = (ulong)this->opt->gnu_file_line;
    pcVar8 = "):";
    if (uVar17 != 0) {
      pcVar8 = ":";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,2 - uVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    fulltext_log_assert_to_stream((ostream *)&local_1a8,rb);
    detail::g_infoContexts::__tls_init();
    uVar15 = (uint)((ulong)(*(long *)(in_FS_OFFSET + -0x28) - *(long *)(in_FS_OFFSET + -0x30)) >> 3)
    ;
    local_218 = this;
    local_210 = rb;
    if (uVar15 != 0) {
      ppIVar11 = IReporter::get_active_contexts();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  logged: ",10);
      if (0 < (int)uVar15) {
        uVar17 = 0;
        do {
          pcVar8 = "          ";
          if (uVar17 == 0) {
            pcVar8 = "";
          }
          lVar14 = 10;
          if (uVar17 == 0) {
            lVar14 = 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,lVar14);
          (*ppIVar11[uVar17]->_vptr_IContextScope[2])(ppIVar11[uVar17],(ostream *)&local_1a8);
          cVar4 = (char)(ostream *)&local_1a8;
          std::ios::widen((char)*(undefined8 *)(local_1a8._M_p + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          uVar17 = uVar17 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar17);
      }
    }
    pAVar6 = local_210;
    if ((local_210->m_decomp).field_0.buf[0x17] < '\0') {
      pSVar16 = (String *)(local_210->m_decomp).field_0.data.ptr;
    }
    else {
      pSVar16 = &local_210->m_decomp;
    }
    std::__cxx11::string::string((string *)local_1c8,(char *)pSVar16,&local_221);
    pJVar5 = local_218;
    pcVar8 = assertString(pAVar6->m_at);
    std::__cxx11::string::string((string *)&local_1e8,pcVar8,&local_222);
    __n = local_1a0;
    std::__cxx11::stringbuf::str();
    pJVar3 = (pJVar5->testCaseData).testcases.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pJVar12 = pJVar3[-1].failures.
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pJVar12 ==
        pJVar3[-1].failures.
        super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = pJVar3[-1].failures.
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)pJVar12 - (long)__first;
      if (lVar14 == 0x7fffffffffffffe0) goto LAB_00146660;
      uVar13 = (lVar14 >> 5) * -0x5555555555555555;
      uVar17 = 1;
      if (pJVar12 != __first) {
        uVar17 = uVar13;
      }
      this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 *)(uVar17 + uVar13);
      if ((_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
           *)0x155555555555554 < this_00) {
        this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                   *)0x155555555555555;
      }
      if (CARRY8(uVar17,uVar13)) {
        this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                   *)0x155555555555555;
      }
      __result = std::
                 _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ::_M_allocate(this_00,(size_t)__n);
      __args_1 = &local_208;
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)(lVar14 + (long)__result),(JUnitTestMessage *)local_1c8,
                 &local_1e8,__args_1,in_R8);
      pJVar12 = std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::_S_relocate(__first,pJVar12,__result,(_Tp_alloc_type *)__args_1);
      if (__first != (pointer)0x0) {
        operator_delete(__first);
      }
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_finish = pJVar12 + 1;
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
    }
    else {
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)pJVar12,(JUnitTestMessage *)local_1c8,&local_1e8,&local_208,in_R8
                );
      ppJVar1 = &pJVar3[-1].failures.
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppJVar1 = *ppJVar1 + 1;
    }
    __mutex = local_220;
    piVar2 = &(local_218->testCaseData).totalFailures;
    *piVar2 = *piVar2 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed) // report only failures & ignore the `success` option
                return;

            std::lock_guard<std::mutex> lock(mutex);

            std::ostringstream os;
            os << skipPathFromFilename(rb.m_file) << (opt.gnu_file_line ? ":" : "(")
              << line(rb.m_line) << (opt.gnu_file_line ? ":" : "):") << std::endl;

            fulltext_log_assert_to_stream(os, rb);
            log_contexts(os);
            testCaseData.addFailure(rb.m_decomp.c_str(), assertString(rb.m_at), os.str());
        }